

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

void MapOptHandler_pixelratio(FMapInfoParser *parse,level_info_t *info)

{
  FGLROptions *pFVar1;
  FName local_14;
  
  FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  pFVar1 = level_info_t::GetOptData<FGLROptions>(info,&local_14,true);
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetFloat(&parse->sc);
  pFVar1->pixelstretch = (float)(parse->sc).Float;
  return;
}

Assistant:

DEFINE_MAP_OPTION(pixelratio, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");

	parse.ParseAssign();
	parse.sc.MustGetFloat();
	opt->pixelstretch = (float)parse.sc.Float;
}